

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall Parser::getTokenPrecedence(Parser *this)

{
  TokenType TVar1;
  OperatorChar OVar2;
  BinaryOperators *pBVar3;
  size_type sVar4;
  mapped_type *this_00;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  key_type local_1b;
  Parser *pPStack_18;
  OperatorChar op;
  Parser *this_local;
  
  pPStack_18 = this;
  TVar1 = Token::type(&this->mCurrentToken);
  if ((TVar1 != OPERATOR) && (TVar1 = Token::type(&this->mCurrentToken), TVar1 != TWO_CHAR_OPERATOR)
     ) {
    return -1;
  }
  OVar2 = anon_unknown.dwarf_6ba02::tokenAsOperator(&this->mCurrentToken);
  local_1b._0_2_ = OVar2._0_2_;
  local_1b.mOp2 = OVar2.mOp2;
  pBVar3 = CalculationEngine::binaryOperators(this->mCalcEngine);
  sVar4 = std::
          unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
          ::count(pBVar3,&local_1b);
  if (sVar4 == 0) {
    OperatorChar::toString_abi_cxx11_(&local_80,&local_1b);
    std::operator+(&local_60,"\'",&local_80);
    std::operator+(&local_40,&local_60,"\' is not a defined binary operator.");
    parseError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    this_local._4_4_ = -1;
  }
  else {
    pBVar3 = CalculationEngine::binaryOperators(this->mCalcEngine);
    this_00 = std::
              unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
              ::at(pBVar3,&local_1b);
    this_local._4_4_ = Operator::precedence(this_00);
  }
  return this_local._4_4_;
}

Assistant:

int Parser::getTokenPrecedence() {
	if (mCurrentToken.type() != TokenType::OPERATOR && mCurrentToken.type() != TokenType::TWO_CHAR_OPERATOR) {
		return -1;
	}

	auto op = tokenAsOperator(mCurrentToken);
	if (mCalcEngine.binaryOperators().count(op) > 0) {
		return mCalcEngine.binaryOperators().at(op).precedence();
	} else {
		parseError("'" + op.toString() + "' is not a defined binary operator.");
	}

	return -1;
}